

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsCommon.cpp
# Opt level: O2

bool helics::tcp::commErrorHandler(CommsInterface *comm,TcpConnection *param_2,error_code *error)

{
  bool bVar1;
  error_category *peVar2;
  string_view message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = CommsInterface::isConnected(comm);
  if (bVar1) {
    peVar2 = asio::error::get_misc_category();
    if ((error->_M_cat != peVar2) || (error->_M_value != 2)) {
      std::error_code::error_code<asio::error::basic_errors,void>
                ((error_code *)&local_b8,operation_aborted);
      if ((error->_M_cat != (error_category *)local_b8._M_string_length) ||
         (error->_M_value != (int)local_b8._M_dataplus._M_p)) {
        std::error_code::error_code<asio::error::basic_errors,void>
                  ((error_code *)&local_b8,connection_reset);
        if ((error->_M_cat != (error_category *)local_b8._M_string_length) ||
           (error->_M_value != (int)local_b8._M_dataplus._M_p)) {
          (**(code **)(*(long *)error->_M_cat + 0x20))(&local_38);
          std::operator+(&local_78,"error message while connected ",&local_38);
          std::operator+(&local_58,&local_78,"code ");
          CLI::std::__cxx11::to_string(&local_98,error->_M_value);
          std::operator+(&local_b8,&local_58,&local_98);
          message._M_str._4_4_ = local_b8._M_dataplus._M_p._4_4_;
          message._M_str._0_4_ = (int)local_b8._M_dataplus._M_p;
          message._M_len = local_b8._M_string_length;
          CommsInterface::logError(comm,message);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_38);
        }
      }
    }
  }
  return false;
}

Assistant:

bool commErrorHandler(CommsInterface* comm,
                          gmlc::networking::TcpConnection* /*connection*/,
                          const std::error_code& error)
    {
        if (comm->isConnected()) {
            if ((error != asio::error::eof) && (error != asio::error::operation_aborted)) {
                if (error != asio::error::connection_reset) {
                    comm->logError("error message while connected " + error.message() + "code " +
                                   std::to_string(error.value()));
                }
            }
        }
        return false;
    }